

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O1

argument * __thiscall
argParserAdvancedConfiguration::getArgument(argParserAdvancedConfiguration *this,string *param)

{
  section *psVar1;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *pvVar2;
  argument *paVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  pointer ppsVar8;
  pointer ppaVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  argument *local_48;
  
  ppsVar8 = (this->newargconfig->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar13 = (this->newargconfig->
           super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
           )._M_impl.super__Vector_impl_data._M_finish != ppsVar8;
  if (bVar13) {
    uVar11 = 0;
    do {
      psVar1 = ppsVar8[uVar11];
      pvVar2 = psVar1->arguments;
      ppaVar9 = (pvVar2->
                super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar14 = (pvVar2->
               super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
               )._M_impl.super__Vector_impl_data._M_finish != ppaVar9;
      if (bVar14) {
        uVar12 = 0;
        do {
          paVar3 = ppaVar9[uVar12];
          iVar7 = std::__cxx11::string::compare((char *)param);
          if (iVar7 == 0) {
LAB_0010a357:
            bVar6 = true;
          }
          else {
            sVar4 = (paVar3->argShort)._M_string_length;
            sVar5 = param->_M_string_length;
            if (((sVar4 != sVar5) ||
                ((sVar4 != 0 &&
                 (iVar7 = bcmp((paVar3->argShort)._M_dataplus._M_p,(param->_M_dataplus)._M_p,sVar4),
                 iVar7 != 0)))) &&
               ((sVar4 = (paVar3->argLong)._M_string_length, sVar4 != sVar5 ||
                ((sVar4 != 0 &&
                 (iVar7 = bcmp((paVar3->argLong)._M_dataplus._M_p,(param->_M_dataplus)._M_p,sVar4),
                 iVar7 != 0)))))) goto LAB_0010a357;
            bVar6 = false;
            local_48 = paVar3;
          }
          if (!bVar6) break;
          uVar12 = uVar12 + 1;
          pvVar2 = psVar1->arguments;
          ppaVar9 = (pvVar2->
                    super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar10 = (long)(pvVar2->
                         super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar9 >> 3;
          bVar14 = uVar12 < uVar10;
        } while (uVar12 < uVar10);
      }
      if (bVar14) break;
      uVar11 = uVar11 + 1;
      ppsVar8 = (this->newargconfig->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(this->newargconfig->
                     super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar8 >> 3;
      bVar13 = uVar11 < uVar12;
    } while (uVar11 < uVar12);
  }
  if (!bVar13) {
    std::__cxx11::string::_M_assign((string *)&this->lastFailedArg);
    local_48 = (argument *)0x0;
  }
  return local_48;
}

Assistant:

argParserAdvancedConfiguration::argument * argParserAdvancedConfiguration::getArgument(string param){

    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++)
    {
        section * sec;
        sec = newargconfig->at(secIndex);

        for(int argIndex = 0; argIndex < sec->arguments->size();argIndex++) {
            argument * arg = sec->arguments->at(argIndex);
                if (param != "" && (arg->argShort == param || arg->argLong == param)) {
                    return arg;
                }
            }
    }
    lastFailedArg = param;
    return nullptr;
}